

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int get_bits_per_mb(AV1_COMP *cpi,int use_cyclic_refresh,double correction_factor,int q)

{
  int iVar1;
  
  if (use_cyclic_refresh != 0) {
    iVar1 = av1_cyclic_refresh_rc_bits_per_mb(cpi,q,correction_factor);
    return iVar1;
  }
  iVar1 = av1_rc_bits_per_mb(cpi,(cpi->common).current_frame.frame_type,q,correction_factor,
                             (cpi->sf).hl_sf.accurate_bit_estimate);
  return iVar1;
}

Assistant:

static int get_bits_per_mb(const AV1_COMP *cpi, int use_cyclic_refresh,
                           double correction_factor, int q) {
  const AV1_COMMON *const cm = &cpi->common;
  return use_cyclic_refresh
             ? av1_cyclic_refresh_rc_bits_per_mb(cpi, q, correction_factor)
             : av1_rc_bits_per_mb(cpi, cm->current_frame.frame_type, q,
                                  correction_factor,
                                  cpi->sf.hl_sf.accurate_bit_estimate);
}